

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O0

void google::protobuf::
     Join<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> start,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,
               char *delim,string *result)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> result_00;
  bool bVar1;
  reference piVar2;
  AlphaNum local_60;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> it;
  string *result_local;
  char *delim_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> start_local;
  
  local_30._M_current = start._M_current;
  it._M_current = (int *)result;
  delim_local = (char *)end._M_current;
  end_local._M_current = start._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           (&local_30,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)&delim_local), bVar1) {
    bVar1 = __gnu_cxx::operator!=(&local_30,&end_local);
    if (bVar1) {
      std::__cxx11::string::append((char *)it._M_current);
    }
    result_00._M_current = it._M_current;
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_30);
    strings::AlphaNum::AlphaNum(&local_60,*piVar2);
    StrAppend((string *)result_00._M_current,&local_60);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_30);
  }
  return;
}

Assistant:

void Join(Iterator start, Iterator end, const char* delim,
          std::string* result) {
  for (Iterator it = start; it != end; ++it) {
    if (it != start) {
      result->append(delim);
    }
    StrAppend(result, *it);
  }
}